

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall
Logger::writeLog(Logger *this,string *kindOfMessage,string *message,string *location)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_58,kindOfMessage,message);
  std::operator+(&bStack_78,&local_58," IN ");
  std::operator+(&local_38,&bStack_78,location);
  std::__cxx11::string::operator=((string *)&this->mLastLog,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  poVar1 = std::operator<<((ostream *)this,(string *)&this->mLastLog);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Logger::writeLog(const std::string &kindOfMessage, const std::string &message, const std::string &location) {
    mLastLog = kindOfMessage + message + " IN " + location;
    mLogStream << mLastLog << std::endl;
}